

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void checkList(IntegrityCk *pCheck,int isFreeList,int iPage,int N)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  u32 uVar4;
  uint *puVar5;
  DbPage *pPg;
  int iVar6;
  BtShared *pBVar7;
  u32 uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  DbPage *pOvflPage;
  DbPage *local_38;
  
  if (0 < N) {
    uVar11 = (ulong)(uint)N;
    uVar10 = iPage;
    do {
      if (pCheck->mxErr == 0) {
        return;
      }
      iVar12 = (int)uVar11;
      if ((int)uVar10 < 1) {
        checkAppendMsg(pCheck,"%d of %d pages missing from overflow list starting at %d",uVar11,
                       (ulong)(uint)N,(ulong)(uint)iPage);
        return;
      }
      iVar6 = checkRef(pCheck,uVar10);
      if (iVar6 != 0) {
        return;
      }
      iVar6 = sqlite3PagerAcquire(pCheck->pPager,uVar10,&local_38,0);
      pPg = local_38;
      if (iVar6 != 0) {
        checkAppendMsg(pCheck,"failed to get page %d",(ulong)uVar10);
        return;
      }
      uVar11 = (ulong)(iVar12 - 1U);
      puVar5 = (uint *)local_38->pData;
      if (isFreeList == 0) {
        if ((iVar12 != 1) && (pCheck->pBt->autoVacuum != '\0')) {
          uVar13 = *puVar5;
          checkPtrmap(pCheck,uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                             uVar13 << 0x18,'\x04',uVar10);
        }
      }
      else {
        uVar13 = puVar5[1];
        bVar1 = *(byte *)((long)puVar5 + 5);
        bVar2 = *(byte *)((long)puVar5 + 6);
        bVar3 = *(byte *)((long)puVar5 + 7);
        pBVar7 = pCheck->pBt;
        if (pBVar7->autoVacuum != '\0') {
          checkPtrmap(pCheck,uVar10,'\x02',0);
          pBVar7 = pCheck->pBt;
        }
        iVar6 = (uint)(byte)uVar13 * 0x1000000;
        iVar9 = (uint)bVar1 * 0x10000;
        uVar14 = (uint)bVar2 * 0x100;
        uVar13 = iVar9 + iVar6 | uVar14 | (uint)bVar3;
        uVar4 = pBVar7->usableSize;
        uVar8 = uVar4 + 3;
        if (-1 < (int)uVar4) {
          uVar8 = uVar4;
        }
        if (((int)uVar8 >> 2) + -2 < (int)uVar13) {
          checkAppendMsg(pCheck,"freelist leaf count too big on page %d",(ulong)uVar10);
          uVar13 = iVar12 - 2;
        }
        else {
          if (0 < (int)uVar13) {
            uVar11 = 0;
            do {
              uVar10 = puVar5[uVar11 + 2];
              uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                       uVar10 << 0x18;
              if (pCheck->pBt->autoVacuum != '\0') {
                checkPtrmap(pCheck,uVar10,'\x02',0);
              }
              checkRef(pCheck,uVar10);
              uVar11 = uVar11 + 1;
            } while (uVar14 + bVar3 + iVar6 + iVar9 != uVar11);
          }
          uVar13 = (iVar12 - 1U) - uVar13;
        }
        uVar11 = (ulong)uVar13;
      }
      uVar10 = *puVar5;
      if (pPg != (DbPage *)0x0) {
        sqlite3PagerUnrefNotNull(pPg);
      }
      uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    } while (0 < (int)uVar11);
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  int iPage,            /* Page number for first page in the list */
  int N                 /* Expected number of pages in the list */
){
  int i;
  int expected = N;
  int iFirst = iPage;
  while( N-- > 0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( iPage<1 ){
      checkAppendMsg(pCheck,
         "%d of %d pages missing from overflow list starting at %d",
          N+1, expected, iFirst);
      break;
    }
    if( checkRef(pCheck, iPage) ) break;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage) ){
      checkAppendMsg(pCheck, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      int n = get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>(int)pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);
  }
}